

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::js::Generator::FindRequiresForExtension
          (Generator *this,GeneratorOptions *options,FieldDescriptor *field,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *required,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *forwards)

{
  int iVar1;
  Descriptor *descriptor;
  _Alloc_hider this_00;
  string local_48;
  
  this_00._M_p = *(pointer *)(*(long *)(field + 0x58) + 8);
  descriptor = (Descriptor *)required;
  iVar1 = std::__cxx11::string::compare(this_00._M_p);
  if (iVar1 != 0) {
    (anonymous_namespace)::GetMessagePath_abi_cxx11_
              (&local_48,(_anonymous_namespace_ *)options,*(GeneratorOptions **)(field + 0x58),
               descriptor);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)required,&local_48);
    this_00._M_p = local_48._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      this_00._M_p = local_48._M_dataplus._M_p;
    }
  }
  FindRequiresForField((Generator *)this_00._M_p,options,field,required,forwards);
  return;
}

Assistant:

void Generator::FindRequiresForExtension(const GeneratorOptions& options,
                                         const FieldDescriptor* field,
                                         std::set<string>* required,
                                         std::set<string>* forwards) const {
    if (field->containing_type()->full_name() != "google.protobuf.bridge.MessageSet") {
      required->insert(GetMessagePath(options, field->containing_type()));
    }
    FindRequiresForField(options, field, required, forwards);
}